

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O3

void __thiscall
wasm::EffectAnalyzer::InternalAnalyzer::visitStructSet(InternalAnalyzer *this,StructSet *curr)

{
  EffectAnalyzer *pEVar1;
  ulong uVar2;
  bool bVar3;
  
  bVar3 = wasm::Type::isNull(&curr->ref->type);
  pEVar1 = this->parent;
  if (bVar3) {
    pEVar1->trap = true;
  }
  else {
    pEVar1->writesStruct = true;
    uVar2 = (curr->ref->type).id;
    if (((uint)uVar2 & 3) == 2 && 6 < uVar2) {
      pEVar1->implicitTrap = true;
    }
    if (curr->order != Unordered) {
      pEVar1->isAtomic = true;
    }
  }
  return;
}

Assistant:

void visitStructSet(StructSet* curr) {
      if (curr->ref->type.isNull()) {
        parent.trap = true;
        return;
      }
      parent.writesStruct = true;
      // traps when the arg is null
      if (curr->ref->type.isNullable()) {
        parent.implicitTrap = true;
      }
      if (curr->order != MemoryOrder::Unordered) {
        parent.isAtomic = true;
      }
    }